

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void inputText(_GLFWwindow *window,uint32_t scancode)

{
  int iVar1;
  xkb_keysym_t keysym_00;
  uint32_t codepoint_00;
  int plain;
  int mods;
  uint32_t codepoint;
  xkb_keysym_t keysym;
  xkb_keycode_t keycode;
  xkb_keysym_t *keysyms;
  _GLFWwindow *p_Stack_10;
  uint32_t scancode_local;
  _GLFWwindow *window_local;
  
  keysyms._4_4_ = scancode;
  p_Stack_10 = window;
  iVar1 = (*_glfw.wl.xkb.state_key_get_syms)
                    (_glfw.wl.xkb.state,scancode + 8,(xkb_keysym_t **)&keysym);
  if (iVar1 == 1) {
    keysym_00 = composeSymbol(*_keysym);
    codepoint_00 = _glfwKeySym2Unicode(keysym_00);
    if (codepoint_00 != 0xffffffff) {
      _glfwInputChar(p_Stack_10,codepoint_00,_glfw.wl.xkb.modifiers,
                     (uint)(((_glfw.wl.xkb.modifiers & 6) != 0 ^ 0xffU) & 1));
    }
  }
  return;
}

Assistant:

static void inputText(_GLFWwindow* window, uint32_t scancode)
{
    const xkb_keysym_t* keysyms;
    const xkb_keycode_t keycode = scancode + 8;

    if (xkb_state_key_get_syms(_glfw.wl.xkb.state, keycode, &keysyms) == 1)
    {
        const xkb_keysym_t keysym = composeSymbol(keysyms[0]);
        const uint32_t codepoint = _glfwKeySym2Unicode(keysym);
        if (codepoint != GLFW_INVALID_CODEPOINT)
        {
            const int mods = _glfw.wl.xkb.modifiers;
            const int plain = !(mods & (GLFW_MOD_CONTROL | GLFW_MOD_ALT));
            _glfwInputChar(window, codepoint, mods, plain);
        }
    }
}